

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int emit_esni_extension(ptls_esni_secret_t *esni,ptls_buffer_t *buf,ptls_iovec_t esni_keys,
                       char *server_name,size_t key_share_ch_off,size_t key_share_ch_len)

{
  size_t sVar1;
  ptls_iovec_t pubkey;
  uint8_t *in_RCX;
  ptls_buffer_t *in_RSI;
  long in_RDI;
  ptls_buffer_t *in_R9;
  ptls_cipher_suite_t *unaff_retaddr;
  int in_stack_0000000c;
  ptls_aead_context_t **in_stack_00000010;
  ptls_iovec_t in_stack_00000018;
  size_t body_size_1;
  size_t bytes_to_pad;
  size_t start_off;
  size_t body_start_1;
  size_t capacity_1;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  uint16_t _v;
  int ret;
  ptls_aead_context_t *aead;
  size_t in_stack_ffffffffffffff58;
  void *in_stack_ffffffffffffff60;
  void *src;
  ptls_buffer_t *in_stack_ffffffffffffff68;
  ptls_buffer_t *buf_00;
  size_t seq;
  ptls_buffer_t *buf_01;
  void *in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff88;
  ptls_buffer_t *in_stack_ffffffffffffff90;
  ptls_aead_context_t *ctx;
  uint8_t *in_stack_ffffffffffffff98;
  size_t sVar2;
  size_t in_stack_ffffffffffffffa0;
  size_t sVar3;
  long local_48;
  int local_3c;
  long *server_name_00;
  
  server_name_00 = (long *)0x0;
  local_3c = create_esni_aead(in_stack_00000010,in_stack_0000000c,unaff_retaddr,in_stack_00000018,
                              in_RCX);
  if (((local_3c == 0) &&
      (local_3c = ptls_buffer__do_pushv
                            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                             in_stack_ffffffffffffff58), local_3c == 0)) &&
     (pubkey.len = in_stack_ffffffffffffffa0, pubkey.base = in_stack_ffffffffffffff98,
     local_3c = push_key_share_entry
                          (in_stack_ffffffffffffff90,
                           (uint16_t)((ulong)in_stack_ffffffffffffff88 >> 0x30),pubkey),
     local_3c == 0)) {
    local_48 = 2;
    seq = 2;
    buf_01 = in_RSI;
    local_3c = ptls_buffer__do_pushv
                         (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                          in_stack_ffffffffffffff58);
    if (local_3c == 0) {
      sVar3 = in_RSI->off;
      local_3c = ptls_buffer__do_pushv
                           (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                            in_stack_ffffffffffffff58);
      if (local_3c == 0) {
        sVar2 = in_RSI->off;
        for (; local_48 != 0; local_48 = local_48 + -1) {
          in_RSI->base[sVar3 - local_48] =
               (uint8_t)(sVar2 - sVar3 >> (((char)local_48 + -1) * '\b' & 0x3fU));
        }
        sVar3 = 2;
        src = (void *)0x2;
        buf_00 = in_RSI;
        local_3c = ptls_buffer__do_pushv(in_RSI,(void *)0x2,in_stack_ffffffffffffff58);
        if (local_3c == 0) {
          sVar2 = in_RSI->off;
          ctx = (ptls_aead_context_t *)in_RSI->off;
          local_3c = ptls_buffer__do_pushv(buf_00,src,in_stack_ffffffffffffff58);
          if ((local_3c == 0) &&
             (local_3c = emit_server_name_extension(in_R9,(char *)server_name_00), local_3c == 0)) {
            if (in_RSI->off - (long)ctx < (ulong)(long)(int)(*(ushort *)(in_RDI + 0xc0) + 0x10)) {
              in_stack_ffffffffffffff88 =
                   (void *)((long)(int)(*(ushort *)(in_RDI + 0xc0) + 0x10) -
                           (in_RSI->off - (long)ctx));
              local_3c = ptls_buffer_reserve(buf_00,(size_t)src);
              if (local_3c != 0) goto LAB_00116b8f;
              memset(in_RSI->base + in_RSI->off,0,(size_t)in_stack_ffffffffffffff88);
              in_RSI->off = (long)in_stack_ffffffffffffff88 + in_RSI->off;
            }
            local_3c = ptls_buffer_reserve(buf_00,(size_t)src);
            if (local_3c == 0) {
              ptls_aead_encrypt(ctx,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                (size_t)buf_01,seq,buf_00,sVar3);
              in_RSI->off = *(long *)(*server_name_00 + 0x38) + in_RSI->off;
              sVar1 = in_RSI->off;
              if (sVar3 == 0xffffffffffffffff) {
                local_3c = ptls_buffer__adjust_quic_blocksize(buf_01,seq);
                if (local_3c != 0) goto LAB_00116b8f;
              }
              else {
                for (; sVar3 != 0; sVar3 = sVar3 - 1) {
                  in_RSI->base[sVar2 - sVar3] =
                       (uint8_t)(sVar1 - sVar2 >> (((char)sVar3 + -1) * '\b' & 0x3fU));
                }
              }
              local_3c = 0;
            }
          }
        }
      }
    }
  }
LAB_00116b8f:
  if (server_name_00 != (long *)0x0) {
    ptls_aead_free((ptls_aead_context_t *)0x116ba1);
  }
  return local_3c;
}

Assistant:

static int emit_esni_extension(ptls_esni_secret_t *esni, ptls_buffer_t *buf, ptls_iovec_t esni_keys, const char *server_name,
                               size_t key_share_ch_off, size_t key_share_ch_len)
{
    ptls_aead_context_t *aead = NULL;
    int ret;

    if ((ret = create_esni_aead(&aead, 1, esni->client.cipher, esni->secret, esni->esni_contents_hash)) != 0)
        goto Exit;

    /* cipher-suite id */
    ptls_buffer_push16(buf, esni->client.cipher->id);
    /* key-share */
    if ((ret = push_key_share_entry(buf, esni->client.key_share->id, esni->client.pubkey)) != 0)
        goto Exit;
    /* record-digest */
    ptls_buffer_push_block(buf, 2, { ptls_buffer_pushv(buf, esni->client.record_digest, esni->client.cipher->hash->digest_size); });
    /* encrypted sni */
    ptls_buffer_push_block(buf, 2, {
        size_t start_off = buf->off;
        /* nonce */
        ptls_buffer_pushv(buf, esni->nonce, PTLS_ESNI_NONCE_SIZE);
        /* emit server-name extension */
        if ((ret = emit_server_name_extension(buf, server_name)) != 0)
            goto Exit;
        /* pad */
        if (buf->off - start_off < (size_t)(esni->client.padded_length + PTLS_ESNI_NONCE_SIZE)) {
            size_t bytes_to_pad = esni->client.padded_length + PTLS_ESNI_NONCE_SIZE - (buf->off - start_off);
            if ((ret = ptls_buffer_reserve(buf, bytes_to_pad)) != 0)
                goto Exit;
            memset(buf->base + buf->off, 0, bytes_to_pad);
            buf->off += bytes_to_pad;
        }
        /* encrypt */
        if ((ret = ptls_buffer_reserve(buf, aead->algo->tag_size)) != 0)
            goto Exit;
        ptls_aead_encrypt(aead, buf->base + start_off, buf->base + start_off, buf->off - start_off, 0, buf->base + key_share_ch_off,
                          key_share_ch_len);
        buf->off += aead->algo->tag_size;
    });

    ret = 0;
Exit:
    if (aead != NULL)
        ptls_aead_free(aead);
    return ret;
}